

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

V0LayerParameter * __thiscall caffe::V1LayerParameter::mutable_layer(V1LayerParameter *this)

{
  V0LayerParameter *this_00;
  V1LayerParameter *this_local;
  
  set_has_layer(this);
  if (this->layer_ == (V0LayerParameter *)0x0) {
    this_00 = (V0LayerParameter *)operator_new(0x100);
    V0LayerParameter::V0LayerParameter(this_00);
    this->layer_ = this_00;
  }
  return this->layer_;
}

Assistant:

inline ::caffe::V0LayerParameter* V1LayerParameter::mutable_layer() {
  set_has_layer();
  if (layer_ == NULL) {
    layer_ = new ::caffe::V0LayerParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.V1LayerParameter.layer)
  return layer_;
}